

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c
# Opt level: O0

_Bool sysbvm_filesystem_isAbsolute(sysbvm_tuple_t path)

{
  _Bool _Var1;
  size_t sVar2;
  undefined1 local_29;
  uint8_t *pathBytes;
  size_t pathSize;
  sysbvm_tuple_t path_local;
  
  _Var1 = sysbvm_tuple_isBytes(path);
  if (_Var1) {
    sVar2 = sysbvm_tuple_getSizeInBytes(path);
    local_29 = false;
    if (sVar2 != 0) {
      local_29 = *(char *)(path + 0x10) == '/';
    }
    path_local._7_1_ = local_29;
  }
  else {
    path_local._7_1_ = false;
  }
  return path_local._7_1_;
}

Assistant:

SYSBVM_API bool sysbvm_filesystem_isAbsolute(sysbvm_tuple_t path)
{
    if(!sysbvm_tuple_isBytes(path))
        return false;

    size_t pathSize = sysbvm_tuple_getSizeInBytes(path);
    uint8_t *pathBytes = SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(path)->bytes;

#ifdef _WIN32
    return pathSize >= 2 && pathBytes[1] == ':';
#else
    return pathSize >= 1 && pathBytes[0] == '/';
#endif
}